

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HillClimbing.cpp
# Opt level: O0

Solution * HillClimbing::runHillClimbing(Solution *solution)

{
  bool bVar1;
  uint uVar2;
  Solution *solution_00;
  undefined1 local_39;
  undefined4 local_28;
  int currentScore;
  int bestScore;
  undefined8 local_18;
  SolutionNeighbourhood *neighbourhood;
  Solution *solution_local;
  
  local_18 = (SolutionNeighbourhood *)operator_new(0x40);
  SolutionNeighbourhood::SolutionNeighbourhood(local_18,solution);
  local_28 = Validator::evaluateSolution(solution);
  while( true ) {
    solution_00 = SolutionNeighbourhood::getNext(local_18);
    local_39 = 0;
    if (solution_00 != (Solution *)0x0) {
      bVar1 = SolutionNeighbourhood::hasEnded(local_18);
      local_39 = bVar1 ^ 0xff;
    }
    if ((local_39 & 1) == 0) break;
    uVar2 = Validator::evaluateSolution(solution_00);
    if ((int)uVar2 < (int)local_28) {
      if (local_18 != (SolutionNeighbourhood *)0x0) {
        SolutionNeighbourhood::~SolutionNeighbourhood(local_18);
        operator_delete(local_18,0x40);
      }
      local_18 = (SolutionNeighbourhood *)operator_new(0x40);
      SolutionNeighbourhood::SolutionNeighbourhood(local_18,solution_00);
      local_28 = uVar2;
    }
  }
  if (local_18 != (SolutionNeighbourhood *)0x0) {
    SolutionNeighbourhood::~SolutionNeighbourhood(local_18);
    operator_delete(local_18,0x40);
  }
  return solution_00;
}

Assistant:

Solution* HillClimbing::runHillClimbing(Solution* solution){

    SolutionNeighbourhood* neighbourhood = new SolutionNeighbourhood(solution);

    int bestScore = Validator::evaluateSolution(*solution);

    //next will undo last move so it can reset the initial solution
    while((solution = neighbourhood->getNext()) && !neighbourhood->hasEnded())
    {
        int currentScore = Validator::evaluateSolution(*solution);
        if(bestScore > currentScore)
        {
            delete neighbourhood;
            neighbourhood = new SolutionNeighbourhood(solution);
            bestScore = currentScore;
        }
    }
    delete neighbourhood;
    return solution;
}